

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixfork.c
# Opt level: O0

int fork_Unix(void)

{
  int iVar1;
  uint uVar2;
  __pid_t _Var3;
  ulong uVar4;
  ssize_t sVar5;
  long lVar6;
  int *piVar7;
  int local_224;
  uint local_20c;
  char local_208 [4];
  int status_1;
  char PipeName [40];
  undefined1 local_1d2 [8];
  sockaddr_un addr;
  int sock;
  int status;
  int i;
  char slavepty [32];
  char termtype [64];
  ssize_t len;
  char tempstring [30];
  char *local_c0;
  char *cmdstring;
  unsigned_short tmp;
  char IOBuf [6];
  sigset_t signals;
  pid_t pid;
  int slot;
  int LispPipeOut;
  int LispPipeIn;
  int UnixPID;
  int UnixToLisp [2];
  int LispToUnix [2];
  
  cmdstring._0_2_ = 0;
  iVar1 = pipe(UnixToLisp);
  if (iVar1 == -1) {
    perror("pipe");
    exit(-1);
  }
  iVar1 = pipe(&LispPipeIn);
  if (iVar1 == -1) {
    perror("pipe");
    exit(-1);
  }
  uVar4 = time((time_t *)0x0);
  StartTime = uVar4 & 0xffffff;
  sigemptyset((sigset_t *)&tmp);
  sigaddset((sigset_t *)&tmp,0x1a);
  sigaddset((sigset_t *)&tmp,0x1d);
  sigaddset((sigset_t *)&tmp,0xe);
  sigaddset((sigset_t *)&tmp,0x19);
  sigaddset((sigset_t *)&tmp,8);
  sigprocmask(0,(sigset_t *)&tmp,(sigset_t *)0x0);
  uVar2 = fork();
  if (uVar2 == 0xffffffff) {
    perror("fork");
    exit(-1);
  }
  if (uVar2 != 0) {
    snprintf((char *)&len,0x1e,"%d",(ulong)(uint)LispPipeIn);
    setenv("LDEPIPEIN",(char *)&len,1);
    snprintf((char *)&len,0x1e,"%d",(ulong)(uint)UnixToLisp[1]);
    setenv("LDEPIPEOUT",(char *)&len,1);
    snprintf((char *)&len,0x1e,"%ld",StartTime);
    setenv("LDESTARTTIME",(char *)&len,1);
    snprintf((char *)&len,0x1e,"%d",(ulong)uVar2);
    setenv("LDEUNIXPID",(char *)&len,1);
    close(UnixToLisp[0]);
    close(UnixPID);
    return 1;
  }
  close(UnixToLisp[1]);
  close(LispPipeIn);
  uVar2 = fcntl(UnixToLisp[0],3,0);
  fcntl(UnixToLisp[0],4,(ulong)(uVar2 & 0xfffff7ff));
  do {
    sVar5 = SAFEREAD(UnixToLisp[0],(char *)((long)&cmdstring + 2),6);
    if (sVar5 == 0) {
      exit(0);
    }
    if (sVar5 < 0) {
      perror("Error reading packet by slave");
      exit(1);
    }
    if (sVar5 != 6) {
      exit(1);
    }
    uVar2 = (uint)cmdstring._5_1_;
    cmdstring._5_1_ = '\x01';
    switch(cmdstring._2_1_) {
    case 'C':
      break;
    case 'F':
      if ((int)uVar2 < 0) {
        printf("No process slots available.\n");
        cmdstring._5_1_ = '\0';
      }
      else {
        sVar5 = SAFEREAD(UnixToLisp[0],(char *)&cmdstring,2);
        if (sVar5 < 0) {
          perror("Slave reading cmd length");
        }
        if ((ushort)cmdstring < 0x1ff) {
          local_c0 = shcom;
        }
        else {
          local_c0 = (char *)malloc((long)(int)((ushort)cmdstring + 5));
        }
        sVar5 = SAFEREAD(UnixToLisp[0],local_c0,(ulong)(ushort)cmdstring);
        if (sVar5 < 0) {
          perror("Slave reading cmd");
        }
        _Var3 = fork();
        if (_Var3 == 0) {
          addr.sun_path._100_4_ = socket(1,1,0);
          if ((int)addr.sun_path._100_4_ < 0) {
            perror("slave socket");
            exit(1);
          }
          snprintf(local_208,0x28,"/tmp/LPU%ld-%d",StartTime,(ulong)uVar2);
          memset(local_1d2,0,0x6e);
          local_1d2._0_2_ = 1;
          strcpy(local_1d2 + 2,local_208);
          addr.sun_path._104_4_ = connect(addr.sun_path._100_4_,(sockaddr *)local_1d2,0x6e);
          if ((int)addr.sun_path._104_4_ < 0) {
            perror("slave connect");
            printf("Name = %s.\n",local_208);
            fflush(_stdout);
            exit(1);
          }
          dup2(addr.sun_path._100_4_,0);
          dup2(addr.sun_path._100_4_,1);
          dup2(addr.sun_path._100_4_,2);
          for (sock = 3; lVar6 = sysconf(4), sock < lVar6; sock = sock + 1) {
            close(sock);
          }
          addr.sun_path._104_4_ = system(local_c0);
          if (local_c0 != shcom) {
            free(local_c0);
          }
          if ((addr.sun_path._104_4_ & 0xffffff00) == 0) {
            local_224._0_1_ = addr.sun_path[0x68];
            local_224._1_1_ = addr.sun_path[0x69];
            local_224._2_1_ = addr.sun_path[0x6a];
            local_224._3_1_ = addr.sun_path[0x6b];
          }
          else {
            local_224 = (int)addr.sun_path._104_4_ >> 8;
          }
          _exit(local_224);
        }
        if (_Var3 == -1) {
          perror("unixcomm: fork");
          cmdstring._5_1_ = '\0';
        }
        else {
          cmdstring._3_1_ = (undefined1)((uint)_Var3 >> 8);
          cmdstring._4_1_ = (undefined1)_Var3;
          cmdstring._6_1_ = (undefined1)((uint)_Var3 >> 0x10);
          cmdstring._7_1_ = (undefined1)((uint)_Var3 >> 0x18);
        }
      }
      break;
    case 'K':
      break;
    case 'P':
    case 'S':
      if ((int)uVar2 < 0) {
        printf("Can\'t get process slot for PTY shell.\n");
        fflush(_stdout);
        cmdstring._5_1_ = '\0';
      }
      else {
        sVar5 = SAFEREAD(UnixToLisp[0],(char *)&cmdstring,2);
        if (sVar5 < 0) {
          perror("Slave reading slave pty len");
        }
        sVar5 = SAFEREAD(UnixToLisp[0],(char *)&status,(ulong)(ushort)cmdstring);
        if (sVar5 < 0) {
          perror("Slave reading slave pty id");
        }
        if (cmdstring._2_1_ == 'P') {
          sVar5 = SAFEREAD(UnixToLisp[0],(char *)&cmdstring,2);
          if (sVar5 < 0) {
            perror("Slave reading cmd length");
          }
          if (0x3f < (ushort)cmdstring) {
            perror("Slave termtype length too long");
          }
          sVar5 = SAFEREAD(UnixToLisp[0],slavepty + 0x18,(ulong)(ushort)cmdstring);
          if (sVar5 < 0) {
            perror("Slave reading termtype");
          }
          slavepty[(ulong)(ushort)cmdstring + 0x18] = '\0';
          sVar5 = SAFEREAD(UnixToLisp[0],(char *)&cmdstring,2);
          if (sVar5 < 0) {
            perror("Slave reading cmd length");
          }
          if ((ushort)cmdstring < 0x1ff) {
            local_c0 = shcom;
          }
          else {
            local_c0 = (char *)malloc((long)(int)((ushort)cmdstring + 5));
          }
          sVar5 = SAFEREAD(UnixToLisp[0],local_c0,(ulong)(ushort)cmdstring);
          if (sVar5 < 0) {
            perror("Slave reading shcom");
          }
        }
        else {
          slavepty[0x18] = '\0';
          local_c0 = shcom;
          shcom[0] = '\0';
        }
        iVar1 = ForkUnixShell(uVar2,(char *)&status,slavepty + 0x18,local_c0);
        if (iVar1 == -1) {
          printf("Impossible failure from ForkUnixShell??\n");
          fflush(_stdout);
          cmdstring._5_1_ = '\0';
        }
        else {
          cmdstring._3_1_ = (undefined1)((uint)iVar1 >> 8);
          cmdstring._4_1_ = (undefined1)iVar1;
          cmdstring._6_1_ = (undefined1)((uint)iVar1 >> 0x10);
          cmdstring._7_1_ = (undefined1)((uint)iVar1 >> 0x18);
        }
      }
      break;
    case 'W':
      local_20c = 0;
      cmdstring._2_1_ = '\0';
      cmdstring._3_1_ = 0;
      do {
        _Var3 = waitpid(-1,(int *)&local_20c,1);
        if (_Var3 != -1) break;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      if ((0 < _Var3) && ((local_20c & 0xff) != 0x7f)) {
        cmdstring._7_1_ = (undefined1)((uint)_Var3 >> 0x18);
        cmdstring._6_1_ = (undefined1)((uint)_Var3 >> 0x10);
        cmdstring._5_1_ = (char)(local_20c >> 8);
        cmdstring._4_1_ = (undefined1)local_20c;
        cmdstring._3_1_ = (undefined1)_Var3;
        cmdstring._2_1_ = (char)((uint)_Var3 >> 8);
      }
    }
    write(UnixPID,(void *)((long)&cmdstring + 2),6);
  } while( true );
}

Assistant:

int fork_Unix(void) {
  int LispToUnix[2], /* Incoming pipe from LISP */
      UnixToLisp[2], /* Outgoing pipe to LISP */
      UnixPID, LispPipeIn, LispPipeOut, slot;
  pid_t pid;
  sigset_t signals;

  char IOBuf[6]; /* XXX: signed, because slot comes from here */
  unsigned short tmp = 0;
  char *cmdstring;

  /* Pipes between LISP subr and process */
  if (pipe(LispToUnix) == -1) {
    perror("pipe");
    exit(-1);
  }
  if (pipe(UnixToLisp) == -1) {
    perror("pipe");
    exit(-1);
  }

  StartTime = time(0);   /* Save the time, to create filenames with */
  StartTime &= 0xFFFFFF; /* as a positive number! */

  /* interrupts need to be blocked here so subprocess won't see them */
  sigemptyset(&signals);
  sigaddset(&signals, SIGVTALRM);
#ifndef MAIKO_OS_HAIKU
  sigaddset(&signals, SIGIO);
#endif
  sigaddset(&signals, SIGALRM);
  sigaddset(&signals, SIGXFSZ);
  sigaddset(&signals, SIGFPE);
  sigprocmask(SIG_BLOCK, &signals, NULL);

  if ((UnixPID = fork()) == -1) { /* Fork off small version of the emulator */
    perror("fork");
    exit(-1);
  }

  if (UnixPID != 0) {
    /* JRB - fork_Unix is now called in ldeboot; leave UnixPipe{In,Out} open
       and put their numbers in the environment so parent can find them */
    /* JDS - NB that sprintf doesn't always return a string! */
    /* NHB - if the return value of snprintf() is greater than or equal to the
     * size argument, the string was too short and some of the printed
     * characters were discarded. However we're printing numbers, so we know
     * that the buffer is big enough
     */
    char tempstring[30];

    (void)snprintf(tempstring, sizeof(tempstring), "%d", UnixToLisp[0]);
    setenv("LDEPIPEIN", tempstring, 1);

    (void)snprintf(tempstring, sizeof(tempstring), "%d", LispToUnix[1]);
    setenv("LDEPIPEOUT", tempstring, 1);

    (void)snprintf(tempstring, sizeof(tempstring), "%ld", StartTime);
    setenv("LDESTARTTIME", tempstring, 1);

    (void)snprintf(tempstring, sizeof(tempstring), "%d", UnixPID);
    setenv("LDEUNIXPID", tempstring, 1);

    close(LispToUnix[0]);
    close(UnixToLisp[1]);
    return (1);
  }

  LispPipeIn = LispToUnix[0];
  LispPipeOut = UnixToLisp[1];
  close(LispToUnix[1]);
  close(UnixToLisp[0]);

  fcntl(LispPipeIn, F_SETFL, fcntl(LispPipeIn, F_GETFL, 0) & ~O_NONBLOCK);

  while (1) {
    ssize_t len;
    len = SAFEREAD(LispPipeIn, IOBuf, 6);
    if (len == 0)
      exit(0);
    if (len < 0) {
      perror("Error reading packet by slave");
      exit(1);
    } else if (len != 6) {
      DBPRINT(("Input packet wrong length: %zd", len));
      exit(1);
    }
    slot = (int)IOBuf[3];
    IOBuf[3] = 1; /* Start by signalling success in return-code */

    switch (IOBuf[0]) {
      case 'S':
      case 'P':          /* Fork PTY shell */
        if (slot >= 0) { /* Found a free slot */
          char termtype[64];
          char slavepty[32]; /* For slave pty name */

          if (SAFEREAD(LispPipeIn, (char *)&tmp, 2) < 0) perror("Slave reading slave pty len");
          if (SAFEREAD(LispPipeIn, slavepty, tmp) < 0) perror("Slave reading slave pty id");

          if (IOBuf[0] == 'P') { /* The new style, which takes term type & command to csh */
            if (SAFEREAD(LispPipeIn, (char *)&tmp, 2) < 0) perror("Slave reading cmd length");
            if (tmp > 63) perror("Slave termtype length too long");
            if (SAFEREAD(LispPipeIn, termtype, tmp) < 0) perror("Slave reading termtype");
            termtype[tmp] = '\0';
            if (SAFEREAD(LispPipeIn, (char *)&tmp, 2) < 0) perror("Slave reading cmd length");
            if (tmp > 510)
              cmdstring = (char *)malloc(tmp + 5);
            else
              cmdstring = shcom;

            if (SAFEREAD(LispPipeIn, cmdstring, tmp) < 0) perror("Slave reading shcom");
          } else /* old style, no args */
          {
            termtype[0] = 0;
            cmdstring = shcom;
            cmdstring[0] = 0;
          }

          /* Alloc a PTY and fork  */
          pid = ForkUnixShell(slot, slavepty, termtype, cmdstring);

          if (pid == -1) {
            printf("Impossible failure from ForkUnixShell??\n");
            fflush(stdout);
            IOBuf[3] = 0;
          } else {
            /* ForkUnixShell sets the pid and standard in/out variables */
            IOBuf[1] = (pid >> 8) & 0xFF;
            IOBuf[2] = pid & 0xFF;
            IOBuf[4] = (pid >> 16) & 0xFF;
            IOBuf[5] = (pid >> 24) & 0xFF;
          }
        } else {
          printf("Can't get process slot for PTY shell.\n");
          fflush(stdout);
          IOBuf[3] = 0;
        }
        break;

      case 'F': /* Fork pipe command */
        if (slot >= 0) {
          /* Read in the length of the shell command, and then the command */
          if (SAFEREAD(LispPipeIn, (char *)&tmp, 2) < 0) perror("Slave reading cmd length");
          if (tmp > 510)
            cmdstring = (char *)malloc(tmp + 5);
          else
            cmdstring = shcom;
          if (SAFEREAD(LispPipeIn, cmdstring, tmp) < 0) perror("Slave reading cmd");
          DBPRINT(("Cmd len = %d.\n", tmp));
          DBPRINT(("Rev'd cmd string: %s\n", cmdstring));
          pid = fork(); /* Fork */

          if (pid == 0) {
            int i;
            int status, sock;
            struct sockaddr_un addr;
            char PipeName[40];
            sock = socket(AF_UNIX, SOCK_STREAM, 0);
            if (sock < 0) {
              perror("slave socket");
              exit(1);
            }
            (void)snprintf(PipeName, sizeof(PipeName), "/tmp/LPU%ld-%d", StartTime, slot);
            memset(&addr, 0, sizeof(struct sockaddr_un));
            addr.sun_family = AF_UNIX;
            strcpy(addr.sun_path, PipeName);
            status =
                connect(sock, (struct sockaddr *)&addr, sizeof(struct sockaddr_un));
            if (status < 0) {
              perror("slave connect");
              printf("Name = %s.\n", PipeName);
              fflush(stdout);
              exit(1);
            } else {
              DBPRINT(("Slave connected on %s.\n", PipeName));
            }

            /* Copy the pipes onto stdin, stdout, and stderr */
            dup2(sock, 0);
            dup2(sock, 1);
            dup2(sock, 2);

            /* Make sure everything else is closed. */
            for (i = 3; i < sysconf(_SC_OPEN_MAX); i++) close(i);

            /* Run the shell command and get the result */
            status = system(cmdstring);
            if (cmdstring != shcom) free(cmdstring);
            /* Comment out to fix USAR 11302 (FXAR 320)
            unlink(PipeName);
            */
            _exit((status & ~0xff) ? (status >> 8) : status);
          }

          /* Check for error doing the fork */
          if (pid == (pid_t)-1) {
            perror("unixcomm: fork");
            IOBuf[3] = 0;
          } else {
            IOBuf[1] = (pid >> 8) & 0xFF;
            IOBuf[2] = pid & 0xFF;
            IOBuf[4] = (pid >> 16) & 0xFF;
            IOBuf[5] = (pid >> 24) & 0xFF;
          }
        } else {
          printf("No process slots available.\n");
          IOBuf[3] = 0; /* Couldn't get a process slot */
        }
        break;

      case 'W': /* Wait for a process to die. */
      {
        int status;

        status = 0;

        IOBuf[0] = 0;
        IOBuf[1] = 0;
        DBPRINT(("About to wait for processes.\n"));
      retry1:
        pid = waitpid(-1, &status, WNOHANG);
        if (pid == -1 && errno == EINTR) goto retry1;
        if (pid > 0) {
          /* Ignore processes which are suspended but haven't exited
             (this shouldn't happen) */
          if (WIFSTOPPED(status)) break;
          IOBuf[5] = (pid >> 24) & 0xFF;
          IOBuf[4] = (pid >> 16) & 0xFF;
          IOBuf[3] = status >> 8;
          IOBuf[2] = status & 0xFF;
          IOBuf[1] = pid & 0xFF;
          IOBuf[0] = (pid >> 8) & 0xFF;
        }
        DBPRINT(("wait3 returned pid = %ld.\n", (long)pid));
      }

      break;

      case 'C': /* Close stdin to subprocess */ break;

      case 'K': /* Kill subprocess */ break;
    } /* End of switch */

    /* Return the status/data packet */
    write(LispPipeOut, IOBuf, 6);
  }
}